

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

mutable_buffers_1 asio::buffer(mutable_buffer *b,size_t max_size_in_bytes)

{
  void *data;
  size_t sVar1;
  size_t local_48;
  mutable_buffer local_38;
  size_t local_28;
  size_t max_size_in_bytes_local;
  mutable_buffer *b_local;
  
  local_28 = max_size_in_bytes;
  max_size_in_bytes_local = (size_t)b;
  data = mutable_buffer::data(b);
  sVar1 = mutable_buffer::size((mutable_buffer *)max_size_in_bytes_local);
  if (sVar1 < local_28) {
    local_48 = mutable_buffer::size((mutable_buffer *)max_size_in_bytes_local);
  }
  else {
    local_48 = local_28;
  }
  mutable_buffer::mutable_buffer(&local_38,data,local_48);
  mutable_buffers_1::mutable_buffers_1((mutable_buffers_1 *)&b_local,&local_38);
  return (mutable_buffers_1)_b_local;
}

Assistant:

inline ASIO_MUTABLE_BUFFER buffer(const mutable_buffer& b,
    std::size_t max_size_in_bytes) ASIO_NOEXCEPT
{
  return ASIO_MUTABLE_BUFFER(
      mutable_buffer(b.data(),
        b.size() < max_size_in_bytes
        ? b.size() : max_size_in_bytes
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
        , b.get_debug_check()
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
        ));
}